

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O1

void __thiscall iDynTree::Direction::Direction(Direction *this,double *in_data,uint in_size)

{
  double dVar1;
  undefined1 auVar2 [16];
  PointerType ptr;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  if (in_size == 3) {
    (this->super_Vector3).m_data[2] = in_data[2];
    dVar1 = in_data[1];
    (this->super_Vector3).m_data[0] = *in_data;
    (this->super_Vector3).m_data[1] = dVar1;
  }
  else {
    reportError("VectorFixSize","constructor",
                "input vector does not have the right number of elements");
    (this->super_Vector3).m_data[0] = 0.0;
    (this->super_Vector3).m_data[1] = 0.0;
    (this->super_Vector3).m_data[2] = 0.0;
  }
  auVar3 = *(undefined1 (*) [16])(this->super_Vector3).m_data;
  dVar1 = (this->super_Vector3).m_data[2];
  dVar6 = dVar1 * dVar1 + auVar3._8_8_ * auVar3._8_8_ + auVar3._0_8_ * auVar3._0_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar6;
  auVar5 = sqrtpd(auVar5,auVar5);
  dVar4 = auVar5._0_8_;
  if (DEFAULT_TOL <= dVar4) {
    if (0.0 < dVar6) {
      auVar2._8_8_ = dVar4;
      auVar2._0_8_ = dVar4;
      auVar3 = divpd(auVar3,auVar2);
      *(undefined1 (*) [16])(this->super_Vector3).m_data = auVar3;
      (this->super_Vector3).m_data[2] = dVar1 / dVar4;
    }
  }
  else {
    (this->super_Vector3).m_data[0] = 1.0;
    (this->super_Vector3).m_data[1] = 0.0;
    (this->super_Vector3).m_data[2] = 0.0;
  }
  return;
}

Assistant:

Direction::Direction(const double* in_data, const unsigned int in_size):
                 VectorFixSize< 3 >(in_data,in_size)
    {
        this->Normalize();
    }